

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

void __thiscall
minja::IfNode::do_render(IfNode *this,ostringstream *out,shared_ptr<minja::Context> *context)

{
  pointer ppVar1;
  Expression *this_00;
  TemplateNode *this_01;
  bool bVar2;
  runtime_error *this_02;
  pointer ppVar3;
  Value local_80;
  
  ppVar3 = (this->cascade).
           super__Vector_base<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->cascade).
           super__Vector_base<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppVar3 == ppVar1) {
      return;
    }
    this_00 = (ppVar3->first).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if (this_00 == (Expression *)0x0) break;
    Expression::evaluate(&local_80,this_00,context);
    bVar2 = Value::to_bool(&local_80);
    Value::~Value(&local_80);
    if (bVar2) break;
    ppVar3 = ppVar3 + 1;
  }
  this_01 = (ppVar3->second).super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (this_01 != (TemplateNode *)0x0) {
    TemplateNode::render(this_01,out,context);
    return;
  }
  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_02,"IfNode.cascade.second is null");
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void do_render(std::ostringstream & out, const std::shared_ptr<Context> & context) const override {
      for (const auto& branch : cascade) {
          auto enter_branch = true;
          if (branch.first) {
            enter_branch = branch.first->evaluate(context).to_bool();
          }
          if (enter_branch) {
            if (!branch.second) throw std::runtime_error("IfNode.cascade.second is null");
              branch.second->render(out, context);
              return;
          }
      }
    }